

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

void writeModelBoundSolution
               (FILE *file,HighsLogOptions *log_options,bool columns,HighsInt dim,
               vector<double,_std::allocator<double>_> *lower,
               vector<double,_std::allocator<double>_> *upper,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,bool have_primal,vector<double,_std::allocator<double>_> *primal,
               bool have_dual,vector<double,_std::allocator<double>_> *dual,bool have_basis,
               vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *status,
               HighsVarType *integrality)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *file_00;
  undefined7 in_register_00000011;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  stringstream ss;
  string local_258;
  string local_238;
  string local_218;
  ulong local_1f8;
  pointer local_1f0;
  pointer local_1e8;
  FILE *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8 = CONCAT44(local_1f8._4_4_,dim);
  local_1e8 = (names->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_1f0 = (names->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar3 = "Rows\n";
  if ((int)CONCAT71(in_register_00000011,columns) != 0) {
    pcVar3 = "Columns\n";
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,pcVar3,
             pcVar3 + (CONCAT71(in_register_00000011,columns) & 0xffffffff) * 3 + 5);
  local_1e0 = file;
  highsFprintfString(file,log_options,&local_218);
  paVar1 = &local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "    Index Status        Lower        Upper       Primal         Dual",0x44);
  if (integrality != (HighsVarType *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Type      ",0xc);
  }
  pcVar3 = "  Name\n";
  if (local_1f0 == local_1e8) {
    pcVar3 = "\n";
  }
  lVar2 = 7;
  if (local_1f0 == local_1e8) {
    lVar2 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,lVar2);
  std::__cxx11::stringbuf::str();
  highsFprintfString(local_1e0,log_options,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if (0 < (int)local_1f8) {
    local_1f8 = local_1f8 & 0xffffffff;
    uVar4 = 0;
    do {
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (have_basis) {
        statusToString_abi_cxx11_
                  (&local_238,
                   (status->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)
                   ._M_impl.super__Vector_impl_data._M_start[uVar4],
                   (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4],
                   (upper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4]);
      }
      else {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
      }
      highsFormatToString_abi_cxx11_
                (&local_258,"%9d   %4s %12g %12g",
                 (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar4],
                 (upper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar4],uVar4 & 0xffffffff,
                 local_238._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
      file_00 = local_1e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if (have_primal) {
        highsFormatToString_abi_cxx11_
                  (&local_258," %12g",
                   (primal->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"             ",0xd)
        ;
      }
      if (have_dual) {
        highsFormatToString_abi_cxx11_
                  (&local_258," %12g",
                   (dual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"             ",0xd)
        ;
      }
      if (integrality != (HighsVarType *)0x0) {
        typeToString_abi_cxx11_(&local_1d8,integrality[uVar4]);
        highsFormatToString_abi_cxx11_(&local_258,"  %s",local_1d8._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
      }
      if (local_1f0 == local_1e8) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      }
      else {
        highsFormatToString_abi_cxx11_
                  (&local_258,"  %-s\n",
                   (names->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
      }
      std::__cxx11::stringbuf::str();
      highsFprintfString(file_00,log_options,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writeModelBoundSolution(
    FILE* file, const HighsLogOptions& log_options, const bool columns,
    const HighsInt dim, const std::vector<double>& lower,
    const std::vector<double>& upper, const std::vector<std::string>& names,
    const bool have_primal, const std::vector<double>& primal,
    const bool have_dual, const std::vector<double>& dual,
    const bool have_basis, const std::vector<HighsBasisStatus>& status,
    const HighsVarType* integrality) {
  const bool have_names = names.size() > 0;
  if (have_names) assert((int)names.size() >= dim);
  if (have_primal) assert((int)primal.size() >= dim);
  if (have_dual) assert((int)dual.size() >= dim);
  if (have_basis) assert((int)status.size() >= dim);
  const bool have_integrality = integrality != NULL;
  std::stringstream ss;
  std::string s = columns ? "Columns\n" : "Rows\n";
  highsFprintfString(file, log_options, s);
  ss.str(std::string());
  ss << "    Index Status        Lower        Upper       Primal         Dual";
  if (have_integrality) ss << "  Type      ";
  if (have_names) {
    ss << "  Name\n";
  } else {
    ss << "\n";
  }
  highsFprintfString(file, log_options, ss.str());
  for (HighsInt ix = 0; ix < dim; ix++) {
    ss.str(std::string());
    std::string var_status_string =
        have_basis ? statusToString(status[ix], lower[ix], upper[ix]) : "";
    ss << highsFormatToString("%9" HIGHSINT_FORMAT "   %4s %12g %12g", ix,
                              var_status_string.c_str(), lower[ix], upper[ix]);
    if (have_primal) {
      ss << highsFormatToString(" %12g", primal[ix]);
    } else {
      ss << "             ";
    }
    if (have_dual) {
      ss << highsFormatToString(" %12g", dual[ix]);
    } else {
      ss << "             ";
    }
    if (have_integrality)
      ss << highsFormatToString("  %s", typeToString(integrality[ix]).c_str());
    if (have_names) {
      ss << highsFormatToString("  %-s\n", names[ix].c_str());
    } else {
      ss << "\n";
    }
    highsFprintfString(file, log_options, ss.str());
  }
}